

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O3

void __thiscall
VariationalBayesEstimatorOnLDA::initializeHyperParam(VariationalBayesEstimatorOnLDA *this)

{
  value_type_conflict1 local_28;
  
  local_28 = 0.1;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&this->_alpha,(ulong)this->_K,&local_28);
  local_28 = 0.05;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&this->_beta,(ulong)this->_V,&local_28);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->_alphaTimeSeries,&this->_alpha);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->_betaTimeSeries,&this->_beta);
  (*this->_vptr_VariationalBayesEstimatorOnLDA[5])(this);
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::initializeHyperParam(){//{{{
    _alpha.assign(_K, 0.1);
    _beta.assign(_V, 0.05);
    _alphaTimeSeries.push_back(_alpha);
    _betaTimeSeries.push_back(_beta);
    this->calculateHyperParamSum();
}